

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGccDepfileLexerHelper.cxx
# Opt level: O0

void __thiscall cmGccDepfileLexerHelper::sanitizeContent(cmGccDepfileLexerHelper *this)

{
  bool bVar1;
  pointer pcVar2;
  iterator __first;
  pointer pcVar3;
  ulong uVar4;
  const_iterator local_b8;
  cmGccStyleDependency *local_b0;
  const_iterator local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_98;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  iterator rit;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_70;
  iterator pit;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  const_iterator local_58;
  const_iterator local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_40;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_38;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  last;
  __normal_iterator<cmGccStyleDependency_*,_std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
  local_20;
  __normal_iterator<cmGccStyleDependency_*,_std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
  local_18;
  iterator it;
  cmGccDepfileLexerHelper *this_local;
  
  it._M_current = (cmGccStyleDependency *)this;
  local_18._M_current =
       (cmGccStyleDependency *)
       std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>::begin
                 (&this->Content);
  while( true ) {
    local_20._M_current =
         (cmGccStyleDependency *)
         std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>::end
                   (&this->Content);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    pcVar2 = __gnu_cxx::
             __normal_iterator<cmGccStyleDependency_*,_std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
             ::operator->(&local_18);
    __first = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin(&pcVar2->paths);
    pcVar2 = __gnu_cxx::
             __normal_iterator<cmGccStyleDependency_*,_std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
             ::operator->(&local_18);
    last._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&pcVar2->paths);
    std::
    sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )__first._M_current,last);
    pcVar2 = __gnu_cxx::
             __normal_iterator<cmGccStyleDependency_*,_std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
             ::operator->(&local_18);
    local_40._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&pcVar2->paths);
    pcVar2 = __gnu_cxx::
             __normal_iterator<cmGccStyleDependency_*,_std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
             ::operator->(&local_18);
    local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(&pcVar2->paths);
    local_38 = std::
               unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                         (local_40,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    )local_48);
    pcVar2 = __gnu_cxx::
             __normal_iterator<cmGccStyleDependency_*,_std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
             ::operator->(&local_18);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_50,&local_38);
    pcVar3 = __gnu_cxx::
             __normal_iterator<cmGccStyleDependency_*,_std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
             ::operator->(&local_18);
    local_60._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&pcVar3->paths);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_58,&local_60);
    pit = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::erase(&pcVar2->paths,local_50,local_58);
    pcVar2 = __gnu_cxx::
             __normal_iterator<cmGccStyleDependency_*,_std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
             ::operator->(&local_18);
    local_70._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&pcVar2->paths);
    while( true ) {
      pcVar2 = __gnu_cxx::
               __normal_iterator<cmGccStyleDependency_*,_std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
               ::operator->(&local_18);
      local_78._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&pcVar2->paths);
      bVar1 = __gnu_cxx::operator!=(&local_70,&local_78);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator->(&local_70);
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_70);
      }
      else {
        pcVar2 = __gnu_cxx::
                 __normal_iterator<cmGccStyleDependency_*,_std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
                 ::operator->(&local_18);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
        ::__normal_iterator<std::__cxx11::string*>
                  ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    *)&rit,&local_70);
        local_70._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::erase(&pcVar2->paths,rit._M_current);
      }
    }
    pcVar2 = __gnu_cxx::
             __normal_iterator<cmGccStyleDependency_*,_std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
             ::operator->(&local_18);
    local_90._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&pcVar2->rules);
    while( true ) {
      pcVar2 = __gnu_cxx::
               __normal_iterator<cmGccStyleDependency_*,_std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
               ::operator->(&local_18);
      local_98._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&pcVar2->rules);
      bVar1 = __gnu_cxx::operator!=(&local_90,&local_98);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator->(&local_90);
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_90);
      }
      else {
        pcVar2 = __gnu_cxx::
                 __normal_iterator<cmGccStyleDependency_*,_std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
                 ::operator->(&local_18);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
        ::__normal_iterator<std::__cxx11::string*>
                  ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    *)&local_a8,&local_90);
        local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::erase(&pcVar2->rules,local_a8);
        local_90._M_current = local_a0;
      }
    }
    pcVar2 = __gnu_cxx::
             __normal_iterator<cmGccStyleDependency_*,_std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
             ::operator->(&local_18);
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&pcVar2->rules);
    if (bVar1) {
      __gnu_cxx::
      __normal_iterator<cmGccStyleDependency_const*,std::vector<cmGccStyleDependency,std::allocator<cmGccStyleDependency>>>
      ::__normal_iterator<cmGccStyleDependency*>
                ((__normal_iterator<cmGccStyleDependency_const*,std::vector<cmGccStyleDependency,std::allocator<cmGccStyleDependency>>>
                  *)&local_b8,&local_18);
      local_b0 = (cmGccStyleDependency *)
                 std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>::erase
                           (&this->Content,local_b8);
      local_18._M_current = local_b0;
    }
    else {
      __gnu_cxx::
      __normal_iterator<cmGccStyleDependency_*,_std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
      ::operator++(&local_18);
    }
  }
  return;
}

Assistant:

void cmGccDepfileLexerHelper::sanitizeContent()
{
  for (auto it = this->Content.begin(); it != this->Content.end();) {
    // remove duplicate path entries
    std::sort(it->paths.begin(), it->paths.end());
    auto last = std::unique(it->paths.begin(), it->paths.end());
    it->paths.erase(last, it->paths.end());

    // Remove empty paths and normalize windows paths
    for (auto pit = it->paths.begin(); pit != it->paths.end();) {
      if (pit->empty()) {
        pit = it->paths.erase(pit);
      } else {
#if defined(_WIN32)
        // Unescape the colon following the drive letter.
        // Some versions of GNU compilers can escape this character.
        // c\:\path must be transformed to c:\path
        if (pit->size() >= 3 && std::toupper((*pit)[0]) >= 'A' &&
            std::toupper((*pit)[0]) <= 'Z' && (*pit)[1] == '\\' &&
            (*pit)[2] == ':') {
          pit->erase(1, 1);
        }
#endif
        ++pit;
      }
    }
    // Remove empty rules
    for (auto rit = it->rules.begin(); rit != it->rules.end();) {
      if (rit->empty()) {
        rit = it->rules.erase(rit);
      } else {
        ++rit;
      }
    }
    // Remove the entry if rules are empty
    if (it->rules.empty()) {
      it = this->Content.erase(it);
    } else {
      ++it;
    }
  }
}